

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

bool __thiscall
duckdb::StringValueScanner::FirstValueEndsOnQuote(StringValueScanner *this,CSVIterator iterator)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  CSVState CVar1;
  char cVar2;
  char *pcVar3;
  CSVStateMachine *pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  this_00 = &(this->super_BaseScanner).state_machine;
  uVar5 = 0;
  do {
    uVar6 = iterator.pos.buffer_pos;
    if (iterator.boundary.end_pos <= uVar6) {
      return false;
    }
    pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    pcVar3 = (this->super_BaseScanner).buffer_handle_ptr;
    CVar1 = pCVar4->transition_array->state_machine[(byte)pcVar3[uVar6]][uVar5];
    uVar5 = (ulong)CVar1;
    iterator.pos.buffer_pos = uVar6 + 1;
  } while ((6 < CVar1) || ((0x62U >> (CVar1 & 0x1f) & 1) == 0));
  cVar2 = pcVar3[uVar6 - 1];
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  return cVar2 == (pCVar4->dialect_options).state_machine_options.quote.value;
}

Assistant:

bool StringValueScanner::FirstValueEndsOnQuote(CSVIterator iterator) const {
	CSVStates current_state;
	current_state.Initialize(CSVState::STANDARD);
	const idx_t to_pos = iterator.GetEndPos();
	while (iterator.pos.buffer_pos < to_pos) {
		state_machine->Transition(current_state, buffer_handle_ptr[iterator.pos.buffer_pos++]);
		if (current_state.IsState(CSVState::DELIMITER) || current_state.IsState(CSVState::CARRIAGE_RETURN) ||
		    current_state.IsState(CSVState::RECORD_SEPARATOR)) {
			return buffer_handle_ptr[iterator.pos.buffer_pos - 2] ==
			       state_machine->dialect_options.state_machine_options.quote.GetValue();
		}
	}
	return false;
}